

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::run_finalizers(CVmObjTable *this)

{
  uint id_00;
  CVmObjPageEntry *this_00;
  CVmObject *pCVar1;
  CVmObjTable *in_RDI;
  vm_obj_id_t id;
  CVmObjPageEntry *entry;
  
  while (in_RDI->finalize_queue_head_ != 0) {
    id_00 = in_RDI->finalize_queue_head_;
    this_00 = get_entry(in_RDI,id_00);
    in_RDI->finalize_queue_head_ = this_00->next_obj_;
    *(ushort *)&this_00->field_0x14 = *(ushort *)&this_00->field_0x14 & 0xffcf | 0x20;
    *(ushort *)&this_00->field_0x14 = *(ushort *)&this_00->field_0x14 & 0xfff3;
    pCVar1 = CVmObjPageEntry::get_vm_obj(this_00);
    (*pCVar1->_vptr_CVmObject[5])(pCVar1,(ulong)id_00);
  }
  return;
}

Assistant:

void CVmObjTable::run_finalizers(VMG0_)
{
    /* keep going until we run out of work or reach our work limit */
    while (finalize_queue_head_ != VM_INVALID_OBJ)
    {
        CVmObjPageEntry *entry;
        vm_obj_id_t id;

        /* get the next object from the queue */
        id = finalize_queue_head_;

        /* get the entry */
        entry = get_entry(id);

        /* remove the entry form the queue */
        finalize_queue_head_ = entry->next_obj_;

        /* mark the object as finalized */
        entry->finalize_state_ = VMOBJ_FINALIZED;

        /* 
         *   the entry is no longer in any queue, so we must mark it as
         *   unreachable -- this ensures that the initial conditions are
         *   correct for the next garbage collection pass, since all
         *   objects not in the work queue must be marked as unreachable
         *   (it doesn't matter whether the object is actually reachable;
         *   the garbage collector will make that determination when it
         *   next runs) 
         */
        entry->reachable_ = VMOBJ_UNREACHABLE;
        
        /* invoke its finalizer */
        entry->get_vm_obj()->invoke_finalizer(vmg_ id);
    }
}